

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O0

void test_string_traits(void)

{
  bool bVar1;
  allocator local_109;
  string local_108 [32];
  undefined1 local_e8 [8];
  opt_str osA;
  string local_c0 [32];
  undefined1 local_a0 [8];
  opt_str os0;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  opt_str os00;
  opt_str os_;
  
  ak_toolbox::compact_optional_ns::compact_optional<string_empty_value,_tag_X>::compact_optional
            ((compact_optional<string_empty_value,_tag_X> *)
             &os00.super_compact_optional_base<string_empty_value>.super_type.field_0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"",2,&local_69);
  ak_toolbox::compact_optional_ns::compact_optional<string_empty_value,_tag_X>::compact_optional
            ((compact_optional<string_empty_value,_tag_X> *)local_48,(value_type *)local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_c0,"",
             (allocator *)&osA.super_compact_optional_base<string_empty_value>.super_type.field_0x1f
            );
  ak_toolbox::compact_optional_ns::compact_optional<string_empty_value,_tag_X>::compact_optional
            ((compact_optional<string_empty_value,_tag_X> *)local_a0,(value_type *)local_c0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &osA.super_compact_optional_base<string_empty_value>.super_type.field_0x1f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"A",&local_109);
  ak_toolbox::compact_optional_ns::compact_optional<string_empty_value,_tag_X>::compact_optional
            ((compact_optional<string_empty_value,_tag_X> *)local_e8,(value_type *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  bVar1 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_empty_value>::
          has_value((compact_optional_base<string_empty_value> *)
                    &os00.super_compact_optional_base<string_empty_value>.super_type.field_0x18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!os_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x40,"void test_string_traits()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_empty_value>::
          has_value((compact_optional_base<string_empty_value> *)local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!os00.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x41,"void test_string_traits()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_empty_value>::
          has_value((compact_optional_base<string_empty_value> *)local_a0);
  if (!bVar1) {
    __assert_fail("os0.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x42,"void test_string_traits()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::compact_optional_base<string_empty_value>::
          has_value((compact_optional_base<string_empty_value> *)local_e8);
  if (!bVar1) {
    __assert_fail("osA.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x43,"void test_string_traits()");
  }
  ak_toolbox::compact_optional_ns::compact_optional<string_empty_value,_tag_X>::~compact_optional
            ((compact_optional<string_empty_value,_tag_X> *)local_e8);
  ak_toolbox::compact_optional_ns::compact_optional<string_empty_value,_tag_X>::~compact_optional
            ((compact_optional<string_empty_value,_tag_X> *)local_a0);
  ak_toolbox::compact_optional_ns::compact_optional<string_empty_value,_tag_X>::~compact_optional
            ((compact_optional<string_empty_value,_tag_X> *)local_48);
  ak_toolbox::compact_optional_ns::compact_optional<string_empty_value,_tag_X>::~compact_optional
            ((compact_optional<string_empty_value,_tag_X> *)
             &os00.super_compact_optional_base<string_empty_value>.super_type.field_0x18);
  return;
}

Assistant:

void test_string_traits()
{
  typedef compact_optional<string_empty_value, class tag_X> opt_str;
  static_assert (sizeof(opt_str) == sizeof(std::string), "size waste");
  
  opt_str os_, os00(std::string("\0\0", 2)), os0(std::string("\0")), osA(std::string("A"));
  assert (!os_.has_value());
  assert (!os00.has_value());
  assert ( os0.has_value());
  assert ( osA.has_value());
}